

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::VarintCases_ExpectTagFromArray_Test::
~VarintCases_ExpectTagFromArray_Test(VarintCases_ExpectTagFromArray_Test *this)

{
  io::anon_unknown_0::VarintCases_ExpectTagFromArray_Test::~VarintCases_ExpectTagFromArray_Test
            ((VarintCases_ExpectTagFromArray_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(VarintCases, ExpectTagFromArray) {
  const VarintCase& kVarintCases_case = GetParam();
  memcpy(buffer_, kVarintCases_case.bytes, kVarintCases_case.size);

  const uint32_t expected_value =
      static_cast<uint32_t>(kVarintCases_case.value);

  // If the expectation succeeds, it should return a pointer past the tag.
  if (kVarintCases_case.size <= 2) {
    EXPECT_TRUE(nullptr == CodedInputStream::ExpectTagFromArray(
                            buffer_, expected_value + 1));
    EXPECT_TRUE(buffer_ + kVarintCases_case.size ==
                CodedInputStream::ExpectTagFromArray(buffer_, expected_value));
  } else {
    EXPECT_TRUE(nullptr ==
                CodedInputStream::ExpectTagFromArray(buffer_, expected_value));
  }
}